

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O2

char16_t *
anon_unknown.dwarf_a6d00::doGetPattern
          (UResourceBundle *res,char *nsName,char *patternKey,UErrorCode *publicStatus,
          UErrorCode *localStatus)

{
  UChar *pUVar1;
  CharString key;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  CharString local_70;
  
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_70.buffer);
  local_70.len = 0;
  *local_70.buffer.ptr = '\0';
  icu_63::StringPiece::StringPiece(&local_80,"NumberElements/");
  icu_63::CharString::append(&local_70,local_80.ptr_,local_80.length_,publicStatus);
  icu_63::StringPiece::StringPiece(&local_90,nsName);
  icu_63::CharString::append(&local_70,local_90.ptr_,local_90.length_,publicStatus);
  icu_63::StringPiece::StringPiece(&local_a0,"/patterns/");
  icu_63::CharString::append(&local_70,local_a0.ptr_,local_a0.length_,publicStatus);
  icu_63::StringPiece::StringPiece(&local_b0,patternKey);
  icu_63::CharString::append(&local_70,local_b0.ptr_,local_b0.length_,publicStatus);
  if (*publicStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = ures_getStringByKeyWithFallback_63(res,local_70.buffer.ptr,(int32_t *)0x0,localStatus);
  }
  else {
    pUVar1 = L"";
  }
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
  return pUVar1;
}

Assistant:

const char16_t*
doGetPattern(UResourceBundle* res, const char* nsName, const char* patternKey, UErrorCode& publicStatus,
             UErrorCode& localStatus) {
    // Construct the path into the resource bundle
    CharString key;
    key.append("NumberElements/", publicStatus);
    key.append(nsName, publicStatus);
    key.append("/patterns/", publicStatus);
    key.append(patternKey, publicStatus);
    if (U_FAILURE(publicStatus)) {
        return u"";
    }
    return ures_getStringByKeyWithFallback(res, key.data(), nullptr, &localStatus);
}